

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.cpp
# Opt level: O0

void __thiscall
TasOptimization::ParticleSwarmState::ParticleSwarmState
          (ParticleSwarmState *this,int cnum_dimensions,vector<double,_std::allocator<double>_> *pp,
          vector<double,_std::allocator<double>_> *pv)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  allocator<bool> local_5d;
  bool local_5c;
  allocator<bool> local_5b;
  bool local_5a;
  allocator<double> local_59;
  double local_58;
  allocator<double> local_49;
  double local_48 [3];
  allocator<double> local_29;
  vector<double,_std::allocator<double>_> *local_28;
  vector<double,_std::allocator<double>_> *pv_local;
  vector<double,_std::allocator<double>_> *pp_local;
  ParticleSwarmState *pPStack_10;
  int cnum_dimensions_local;
  ParticleSwarmState *this_local;
  
  this->positions_initialized = true;
  this->velocities_initialized = true;
  this->best_positions_initialized = false;
  this->cache_initialized = false;
  this->num_dimensions = cnum_dimensions;
  local_28 = pv;
  pv_local = pp;
  pp_local._4_4_ = cnum_dimensions;
  pPStack_10 = this;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(pp);
  this->num_particles = (int)(sVar3 / (ulong)(long)this->num_dimensions);
  std::vector<double,_std::allocator<double>_>::vector(&this->particle_positions,pv_local);
  std::vector<double,_std::allocator<double>_>::vector(&this->particle_velocities,local_28);
  iVar1 = this->num_dimensions;
  iVar2 = this->num_particles;
  std::allocator<double>::allocator(&local_29);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->best_particle_positions,(long)((iVar2 + 1) * iVar1),&local_29);
  std::allocator<double>::~allocator(&local_29);
  iVar1 = this->num_particles;
  local_48[0] = std::numeric_limits<double>::max();
  std::allocator<double>::allocator(&local_49);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->cache_particle_fvals,(long)iVar1,local_48,&local_49);
  std::allocator<double>::~allocator(&local_49);
  iVar1 = this->num_particles;
  local_58 = std::numeric_limits<double>::max();
  std::allocator<double>::allocator(&local_59);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->cache_best_particle_fvals,(long)(iVar1 + 1),&local_58,&local_59);
  std::allocator<double>::~allocator(&local_59);
  iVar1 = this->num_particles;
  local_5a = false;
  std::allocator<bool>::allocator(&local_5b);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->cache_particle_inside,(long)iVar1,&local_5a,&local_5b);
  std::allocator<bool>::~allocator(&local_5b);
  iVar1 = this->num_particles;
  local_5c = false;
  std::allocator<bool>::allocator(&local_5d);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->cache_best_particle_inside,(long)(iVar1 + 1),&local_5c,&local_5d);
  std::allocator<bool>::~allocator(&local_5d);
  return;
}

Assistant:

ParticleSwarmState::ParticleSwarmState(int cnum_dimensions, std::vector<double> &&pp, std::vector<double> &&pv):
        positions_initialized(true), velocities_initialized(true), best_positions_initialized(false), cache_initialized(false),
        num_dimensions(cnum_dimensions), num_particles(pp.size() / num_dimensions),
        particle_positions(std::move(pp)), particle_velocities(std::move(pv)),
        best_particle_positions(std::vector<double>((num_particles + 1) * num_dimensions)),
        cache_particle_fvals(std::vector<double>(num_particles, std::numeric_limits<double>::max())),
        cache_best_particle_fvals(std::vector<double>(num_particles + 1, std::numeric_limits<double>::max())),
        cache_particle_inside(std::vector<bool>(num_particles, false)),
        cache_best_particle_inside(std::vector<bool>(num_particles + 1, false)) {}